

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlation_suite.cpp
# Opt level: O0

void double_suite::test_hinton(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe48;
  double local_1a0;
  value_type local_198;
  value_type local_190;
  double local_180;
  value_type local_178;
  value_type local_170;
  double local_160;
  value_type local_158;
  value_type local_150;
  double local_140;
  value_type local_138;
  value_type local_130;
  double local_120;
  value_type local_118;
  value_type local_110;
  double local_100;
  value_type local_f8;
  value_type local_f0;
  double local_e0;
  value_type local_d8;
  value_type local_d0;
  double local_c0;
  value_type local_b8;
  value_type local_b0;
  double local_a0;
  value_type local_98;
  value_type local_90;
  double local_80;
  value_type local_78;
  undefined1 local_70 [8];
  correlation<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.y_moment.sum,1e-05,absolute_tolerance);
  trial::online::cumulative::correlation<double>::correlation((correlation<double> *)local_70);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,40.0,58.0);
  local_78 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_80 = 1.0;
  local_90 = filter.y_moment.sum.variance;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x21,0x1043a9,(char *)&local_78,&local_80,in_stack_fffffffffffffe48,
             predicate_08);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,43.0,73.0);
  local_98 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_a0 = 1.0;
  local_b0 = filter.y_moment.sum.variance;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x23,0x1043a9,(char *)&local_98,&local_a0,in_stack_fffffffffffffe48,
             predicate_07);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,18.0,56.0);
  local_b8 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_c0 = 0.67543;
  local_d0 = filter.y_moment.sum.variance;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.67543","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x25,0x1043a9,(char *)&local_b8,&local_c0,in_stack_fffffffffffffe48,
             predicate_06);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,10.0,47.0);
  local_d8 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_e0 = 0.84317;
  local_f0 = filter.y_moment.sum.variance;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.84317","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x27,0x1043a9,(char *)&local_d8,&local_e0,in_stack_fffffffffffffe48,
             predicate_05);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,25.0,58.0);
  local_f8 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_100 = 0.84181;
  local_110 = filter.y_moment.sum.variance;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.84181","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x29,0x1043a9,(char *)&local_f8,&local_100,in_stack_fffffffffffffe48,
             predicate_04);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,33.0,54.0);
  local_118 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70)
  ;
  local_120 = 0.77024;
  local_130 = filter.y_moment.sum.variance;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.77024","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x2b,0x1043a9,(char *)&local_118,&local_120,in_stack_fffffffffffffe48,
             predicate_03);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,27.0,45.0);
  local_138 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70)
  ;
  local_140 = 0.67569;
  local_150 = filter.y_moment.sum.variance;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.67569","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x2d,0x1043a9,(char *)&local_138,&local_140,in_stack_fffffffffffffe48,
             predicate_02);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,17.0,32.0);
  local_158 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70)
  ;
  local_160 = 0.68849;
  local_170 = filter.y_moment.sum.variance;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.68849","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x2f,0x1043a9,(char *)&local_158,&local_160,in_stack_fffffffffffffe48,
             predicate_01);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,30.0,68.0);
  local_178 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70)
  ;
  local_180 = 0.66685;
  local_190 = filter.y_moment.sum.variance;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.66685","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x31,0x1043a9,(char *)&local_178,&local_180,in_stack_fffffffffffffe48,
             predicate_00);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,47.0,69.0);
  local_198 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70)
  ;
  local_1a0 = 0.72071;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.72071","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x33,0x1043a9,(char *)&local_198,&local_1a0,in_stack_fffffffffffffe48,
             predicate);
  return;
}

Assistant:

void test_hinton()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::correlation<double> filter;
    filter.push(40.0, 58.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(43.0, 73.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(18.0, 56.0);
    TRIAL_TEST_WITH(filter.value(), 0.67543, tolerance);
    filter.push(10.0, 47.0);
    TRIAL_TEST_WITH(filter.value(), 0.84317, tolerance);
    filter.push(25.0, 58.0);
    TRIAL_TEST_WITH(filter.value(), 0.84181, tolerance);
    filter.push(33.0, 54.0);
    TRIAL_TEST_WITH(filter.value(), 0.77024, tolerance);
    filter.push(27.0, 45.0);
    TRIAL_TEST_WITH(filter.value(), 0.67569, tolerance);
    filter.push(17.0, 32.0);
    TRIAL_TEST_WITH(filter.value(), 0.68849, tolerance);
    filter.push(30.0, 68.0);
    TRIAL_TEST_WITH(filter.value(), 0.66685, tolerance);
    filter.push(47.0, 69.0);
    TRIAL_TEST_WITH(filter.value(), 0.72071, tolerance);
}